

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O1

TestCase * __thiscall
iutest::UnitTestImpl::AddTestCase<iutest::TypedTestCase<char32_t>>
          (UnitTestImpl *this,char *testcase_name,TestTypeId id,SetUpMethod setup,
          TearDownMethod teardown)

{
  TypedTestCase<char32_t> *pTVar1;
  TypedTestCase<char32_t> *this_00;
  TypedTestCase<char32_t> *pTVar2;
  iuTestCases *this_01;
  bool bVar3;
  FindOp func;
  FindOp local_40;
  
  this_01 = &this->m_testcases;
  local_40.m_id = id;
  local_40.m_name = testcase_name;
  this_00 = (TypedTestCase<char32_t> *)
            iutest::detail::iu_list<iutest::TestCase>::find<iutest::TestCase::FindOp>
                      (this_01,&local_40);
  if (this_00 == (TypedTestCase<char32_t> *)0x0) {
    this_00 = (TypedTestCase<char32_t> *)operator_new(0xd0);
    TypedTestCase<char32_t>::TypedTestCase(this_00,testcase_name,id,setup,teardown);
    pTVar2 = (TypedTestCase<char32_t> *)this_01->m_node;
    if ((TypedTestCase<char32_t> *)this_01->m_node == (TypedTestCase<char32_t> *)0x0) {
      this_01->m_node = (node_ptr)this_00;
    }
    else {
      do {
        pTVar1 = (TypedTestCase<char32_t> *)
                 (pTVar2->super_TestCase).super_iu_list_node<iutest::TestCase>.next;
        if (pTVar1 == (TypedTestCase<char32_t> *)0x0) {
          (pTVar2->super_TestCase).super_iu_list_node<iutest::TestCase>.next = (value_ptr)this_00;
          (this_00->super_TestCase).super_iu_list_node<iutest::TestCase>.prev =
               &pTVar2->super_TestCase;
          return &this_00->super_TestCase;
        }
        bVar3 = pTVar2 != this_00;
        pTVar2 = pTVar1;
      } while (bVar3);
    }
  }
  return &this_00->super_TestCase;
}

Assistant:

TestCase* AddTestCase(const char* testcase_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        TestCase* p = FindTestCase(testcase_name, id);
        if( p == NULL )
        {
            p = new T (testcase_name, id, setup, teardown);
            m_testcases.push_back(p);
        }
        return p;
    }